

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O2

uint64_t aom_var_2d_u8_c(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  iVar5 = 0;
  uVar6 = 0;
  if (0 < width) {
    uVar6 = (ulong)(uint)width;
  }
  iVar7 = 0;
  if (0 < height) {
    iVar7 = height;
  }
  lVar4 = 0;
  lVar2 = 0;
  for (; iVar5 != iVar7; iVar5 = iVar5 + 1) {
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      bVar1 = src[uVar3];
      lVar2 = lVar2 + (ulong)bVar1;
      lVar4 = lVar4 + (ulong)((uint)bVar1 * (uint)bVar1);
    }
    src = src + src_stride;
  }
  return lVar4 - (ulong)(lVar2 * lVar2) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u8_c(uint8_t *src, int src_stride, int width, int height) {
  int r, c;
  uint64_t ss = 0, s = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const uint8_t v = src[c];
      ss += v * v;
      s += v;
    }
    src += src_stride;
  }

  return (ss - s * s / (width * height));
}